

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::do_socket(Server *this)

{
  int iVar1;
  undefined4 local_14;
  Server *pSStack_10;
  int enable;
  Server *this_local;
  
  local_14 = 1;
  pSStack_10 = this;
  iVar1 = socket(2,0x801,0);
  this->server_sock = iVar1;
  if (this->server_sock < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0x32);
    fprintf(_stderr,"--> %s\n","this->server_sock");
    perror("info");
    exit(1);
  }
  iVar1 = setsockopt(this->server_sock,1,2,&local_14,4);
  if (iVar1 < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0x33);
    fprintf(_stderr,"--> %s\n",
            "setsockopt(this->server_sock, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(int))");
    perror("info");
    exit(1);
  }
  iVar1 = setsockopt(this->server_sock,1,0xf,&local_14,4);
  if (iVar1 < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0x34);
    fprintf(_stderr,"--> %s\n",
            "setsockopt(this->server_sock, SOL_SOCKET, SO_REUSEPORT, &enable, sizeof(int))");
    perror("info");
    exit(1);
  }
  return;
}

Assistant:

void Server::do_socket() {
    int enable = 1;
    this->server_sock = socket(AF_INET, SOCK_STREAM | SOCK_NONBLOCK, 0);
    IF_NEGATIVE_EXIT(this->server_sock);
    IF_NEGATIVE_EXIT(setsockopt(this->server_sock, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(int)));
    IF_NEGATIVE_EXIT(setsockopt(this->server_sock, SOL_SOCKET, SO_REUSEPORT, &enable, sizeof(int)));
}